

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_strip_flags_test.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char **in_RSI;
  int local_3c;
  char **local_38;
  string local_30;
  
  local_38 = in_RSI;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Usage message","");
  gflags::SetUsageMessage(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  gflags::ParseCommandLineFlags(&local_3c,&local_38,false);
  puts(*local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  SetUsageMessage("Usage message");
  ParseCommandLineFlags(&argc, &argv, false);

  // Unfortunately, for us, libtool can replace executables with a shell
  // script that does some work before calling the 'real' executable
  // under a different name.  We need the 'real' executable name to run
  // 'strings' on it, so we construct this binary to print the real
  // name (argv[0]) on stdout when run.
  puts(argv[0]);

  return 0;
}